

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O1

void __thiscall chrono::ChLinkRSDA::AdjustAngle(ChLinkRSDA *this)

{
  double dVar1;
  int iVar2;
  
  dVar1 = this->m_last_angle;
  if ((1.5707963267948966 < dVar1) && (this->m_angle < 0.0)) {
    this->m_angle = this->m_angle + 6.283185307179586;
  }
  if ((dVar1 < -1.5707963267948966) && (0.0 < this->m_angle)) {
    this->m_angle = this->m_angle + -1.5707963267948966;
  }
  dVar1 = dVar1 - this->m_angle;
  if (3.141592653589793 < dVar1) {
    this->m_turns = this->m_turns + 1;
  }
  if (dVar1 < -3.141592653589793) {
    this->m_turns = this->m_turns + -1;
  }
  if ((this->m_angle < 0.0) && (0 < this->m_turns)) {
    dVar1 = this->m_angle;
    iVar2 = this->m_turns + 1;
    do {
      dVar1 = dVar1 + 6.283185307179586;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
    this->m_angle = dVar1;
    this->m_turns = 0;
  }
  if ((0.0 < this->m_angle) && (iVar2 = this->m_turns, iVar2 < 0)) {
    dVar1 = this->m_angle;
    do {
      dVar1 = dVar1 + -6.283185307179586;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0);
    this->m_angle = dVar1;
    this->m_turns = 0;
  }
  this->m_last_angle = this->m_angle;
  return;
}

Assistant:

void ChLinkRSDA::AdjustAngle() {
    // Check cross at +- pi
    if (m_last_angle > CH_C_PI_2 && m_angle < 0)
        m_angle += CH_C_2PI;
    if (m_last_angle < -CH_C_PI_2 && m_angle > 0)
        m_angle -= CH_C_PI_2;

    // Accumulate full turns
    if (m_last_angle - m_angle > CH_C_PI)
        m_turns++;
    if (m_last_angle - m_angle < -CH_C_PI)
        m_turns--;

    if (m_angle < 0) {
        while (m_turns > 0) {
            m_angle += CH_C_2PI;
            m_turns--;
        }
    }
    if (m_angle > 0) {
        while (m_turns < 0) {
            m_angle -= CH_C_2PI;
            m_turns++;
        }
    }

    // Update last angle
    m_last_angle = m_angle;
}